

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

void If_DsdManCollect_rec(If_DsdMan_t *p,int Id,Vec_Int_t *vNodes,Vec_Int_t *vFirsts,int *pnSupp)

{
  int iVar1;
  int iVar2;
  If_DsdObj_t *pObj_00;
  bool bVar3;
  If_DsdObj_t *pObj;
  int local_38;
  int iFirst;
  int iFanin;
  int i;
  int *pnSupp_local;
  Vec_Int_t *vFirsts_local;
  Vec_Int_t *vNodes_local;
  int Id_local;
  If_DsdMan_t *p_local;
  
  pObj_00 = If_DsdVecObj(&p->vObjs,Id);
  iVar1 = If_DsdObjType(pObj_00);
  if (iVar1 != 1) {
    iVar1 = If_DsdObjType(pObj_00);
    if (iVar1 == 2) {
      *pnSupp = *pnSupp + 1;
    }
    else {
      iVar1 = *pnSupp;
      iFirst = 0;
      while( true ) {
        iVar2 = If_DsdObjFaninNum(pObj_00);
        bVar3 = false;
        if (iFirst < iVar2) {
          local_38 = If_DsdObjFaninLit(pObj_00,iFirst);
          bVar3 = local_38 != 0;
        }
        if (!bVar3) break;
        iVar2 = Abc_Lit2Var(local_38);
        If_DsdManCollect_rec(p,iVar2,vNodes,vFirsts,pnSupp);
        iFirst = iFirst + 1;
      }
      Vec_IntPush(vNodes,Id);
      Vec_IntPush(vFirsts,iVar1);
    }
  }
  return;
}

Assistant:

void If_DsdManCollect_rec( If_DsdMan_t * p, int Id, Vec_Int_t * vNodes, Vec_Int_t * vFirsts, int * pnSupp )
{
    int i, iFanin, iFirst;
    If_DsdObj_t * pObj = If_DsdVecObj( &p->vObjs, Id );
    if ( If_DsdObjType(pObj) == IF_DSD_CONST0 )
        return;
    if ( If_DsdObjType(pObj) == IF_DSD_VAR )
    {
        (*pnSupp)++;
        return;
    }
    iFirst = *pnSupp;
    If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
        If_DsdManCollect_rec( p, Abc_Lit2Var(iFanin), vNodes, vFirsts, pnSupp );
    Vec_IntPush( vNodes, Id );
    Vec_IntPush( vFirsts, iFirst );
}